

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.h
# Opt level: O1

void __thiscall wallet::WalletRescanReserver::~WalletRescanReserver(WalletRescanReserver *this)

{
  long lVar1;
  _Manager_type p_Var2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_could_reserve == true) {
    LOCK();
    (this->m_wallet->fScanningWallet)._M_base._M_i = false;
    UNLOCK();
    LOCK();
    (this->m_wallet->m_scanning_with_passphrase)._M_base._M_i = false;
    UNLOCK();
  }
  p_Var2 = (this->m_now).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->m_now,(_Any_data *)&this->m_now,__destroy_functor);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~WalletRescanReserver()
    {
        if (m_could_reserve) {
            m_wallet.fScanningWallet = false;
            m_wallet.m_scanning_with_passphrase = false;
        }
    }